

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O2

void __thiscall
InplaceSolverIslandCallback::processIsland
          (InplaceSolverIslandCallback *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifolds,int numManifolds,int islandId)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  btConstraintSolver *pbVar6;
  btTypedConstraint **ppbVar7;
  _func_int **pp_Var8;
  btTypedConstraint **_Val;
  bool bVar9;
  undefined8 in_stack_ffffffffffffff98;
  btContactSolverInfo *pbVar10;
  btIDebugDraw *pbVar11;
  btDispatcher *pbVar12;
  
  ppbVar7 = this->m_sortedConstraints;
  if (islandId < 0) {
    pbVar6 = this->m_solver;
    uVar3 = (ulong)(uint)this->m_numConstraints;
    pp_Var8 = pbVar6->_vptr_btConstraintSolver;
    pbVar12 = this->m_dispatcher;
    pbVar11 = this->m_debugDrawer;
    pbVar10 = this->m_solverInfo;
  }
  else {
    uVar1 = this->m_numConstraints;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    _Val = ppbVar7;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      iVar4 = ((*_Val)->m_rbA->super_btCollisionObject).m_islandTag1;
      if (iVar4 < 0) {
        iVar4 = ((*_Val)->m_rbB->super_btCollisionObject).m_islandTag1;
      }
      if (iVar4 == islandId) goto LAB_00182541;
      _Val = _Val + 1;
    }
    _Val = (btTypedConstraint **)0x0;
    uVar5 = uVar3;
LAB_00182541:
    uVar2 = 0;
    for (; (long)uVar5 < (long)(int)uVar1; uVar5 = uVar5 + 1) {
      iVar4 = (ppbVar7[uVar5]->m_rbA->super_btCollisionObject).m_islandTag1;
      if (iVar4 < 0) {
        iVar4 = (ppbVar7[uVar5]->m_rbB->super_btCollisionObject).m_islandTag1;
      }
      uVar2 = uVar2 + (iVar4 == islandId);
    }
    pbVar10 = this->m_solverInfo;
    if (1 < (pbVar10->super_btContactSolverInfoData).m_minimumSolverBatchSize) {
      uVar3 = 0;
      if (0 < numBodies) {
        uVar3 = (ulong)(uint)numBodies;
      }
      while (bVar9 = uVar3 != 0, uVar3 = uVar3 - 1, bVar9) {
        btAlignedObjectArray<btCollisionObject_*>::push_back(&this->m_bodies,bodies);
        bodies = bodies + 1;
      }
      uVar3 = 0;
      if (0 < numManifolds) {
        uVar3 = (ulong)(uint)numManifolds;
      }
      while (bVar9 = uVar3 != 0, uVar3 = uVar3 - 1, bVar9) {
        btAlignedObjectArray<btPersistentManifold_*>::push_back(&this->m_manifolds,manifolds);
        manifolds = manifolds + 1;
      }
      uVar3 = (ulong)uVar2;
      while (bVar9 = uVar3 != 0, uVar3 = uVar3 - 1, bVar9) {
        btAlignedObjectArray<btTypedConstraint_*>::push_back(&this->m_constraints,_Val);
        _Val = _Val + 1;
      }
      if ((this->m_manifolds).m_size + (this->m_constraints).m_size <=
          (this->m_solverInfo->super_btContactSolverInfoData).m_minimumSolverBatchSize) {
        return;
      }
      processConstraints(this);
      return;
    }
    pbVar6 = this->m_solver;
    pbVar11 = this->m_debugDrawer;
    pbVar12 = this->m_dispatcher;
    pp_Var8 = pbVar6->_vptr_btConstraintSolver;
    uVar3 = CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),uVar2);
    ppbVar7 = _Val;
  }
  (*pp_Var8[3])(pbVar6,bodies,numBodies,manifolds,numManifolds,ppbVar7,uVar3,pbVar10,pbVar11,pbVar12
               );
  return;
}

Assistant:

virtual	void	processIsland(btCollisionObject** bodies,int numBodies,btPersistentManifold**	manifolds,int numManifolds, int islandId)
	{
		if (islandId<0)
		{
			///we don't split islands, so all constraints/contact manifolds/bodies are passed into the solver regardless the island id
			m_solver->solveGroup( bodies,numBodies,manifolds, numManifolds,&m_sortedConstraints[0],m_numConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
		} else
		{
				//also add all non-contact constraints/joints for this island
			btTypedConstraint** startConstraint = 0;
			int numCurConstraints = 0;
			int i;

			//find the first constraint for this island
			for (i=0;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId(m_sortedConstraints[i]) == islandId)
				{
					startConstraint = &m_sortedConstraints[i];
					break;
				}
			}
			//count the number of constraints in this island
			for (;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId(m_sortedConstraints[i]) == islandId)
				{
					numCurConstraints++;
				}
			}

			if (m_solverInfo->m_minimumSolverBatchSize<=1)
			{
				m_solver->solveGroup( bodies,numBodies,manifolds, numManifolds,startConstraint,numCurConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
			} else
			{

				for (i=0;i<numBodies;i++)
					m_bodies.push_back(bodies[i]);
				for (i=0;i<numManifolds;i++)
					m_manifolds.push_back(manifolds[i]);
				for (i=0;i<numCurConstraints;i++)
					m_constraints.push_back(startConstraint[i]);
				if ((m_constraints.size()+m_manifolds.size())>m_solverInfo->m_minimumSolverBatchSize)
				{
					processConstraints();
				} else
				{
					//printf("deferred\n");
				}
			}
		}
	}